

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

sunrealtype N_VMinQuotient_SensWrapper(N_Vector num,N_Vector denom)

{
  long *in_RDI;
  N_Vector num_00;
  sunrealtype tmp;
  sunrealtype min;
  int i;
  N_Vector in_stack_ffffffffffffffd8;
  N_Vector in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  num_00 = (N_Vector)N_VMinQuotient(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_14 = 1; local_14 < *(int *)(*in_RDI + 8); local_14 = local_14 + 1) {
    in_stack_ffffffffffffffd8 = (N_Vector)N_VMinQuotient(num_00,in_stack_ffffffffffffffd8);
    if ((double)in_stack_ffffffffffffffd8 < (double)num_00) {
      num_00 = in_stack_ffffffffffffffd8;
    }
  }
  return (sunrealtype)num_00;
}

Assistant:

sunrealtype N_VMinQuotient_SensWrapper(N_Vector num, N_Vector denom)
{
  int i;
  sunrealtype min, tmp;

  min = N_VMinQuotient(NV_VEC_SW(num, 0), NV_VEC_SW(denom, 0));

  for (i = 1; i < NV_NVECS_SW(num); i++)
  {
    tmp = N_VMinQuotient(NV_VEC_SW(num, i), NV_VEC_SW(denom, i));
    if (tmp < min) { min = tmp; }
  }

  return (min);
}